

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O1

_Bool xdr_reply_encode(XDR *xdrs,rpc_msg *dmsg)

{
  reply_body *__dscmp;
  anon_union_432_2_d8689e7e_for_ru *__unp;
  reply_stat rVar1;
  uint uVar2;
  msg_type mVar3;
  accept_stat aVar4;
  uint *puVar5;
  bool bVar6;
  _Bool _Var7;
  bool_t bVar8;
  uint *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  xdr_discrim *__choices;
  undefined8 uVar12;
  byte unaff_BPL;
  uint32_t uVar13;
  char *pcVar14;
  xdrproc_t in_R8;
  uint *puVar15;
  
  __dscmp = &(dmsg->ru).RM_rmb;
  rVar1 = (dmsg->ru).RM_rmb.rp_stat;
  if (rVar1 == MSG_DENIED) {
    puVar9 = (uint *)xdrs->x_data;
    puVar5 = (uint *)(xdrs->x_v).vio_wrap;
    puVar15 = puVar9 + 3;
    if (puVar5 < puVar15) {
      puVar9 = (uint *)0x0;
    }
    else {
      xdrs->x_data = (uint8_t *)puVar15;
      if ((xdrs->x_v).vio_tail < puVar15) {
        (xdrs->x_v).vio_tail = (uint8_t *)puVar15;
        *(uint **)((long)xdrs->x_base + 0x10) = puVar15;
      }
    }
    uVar2 = dmsg->rm_xid;
    if (puVar9 == (uint *)0x0) {
      puVar15 = (uint *)((long)xdrs->x_data + 4);
      if (puVar15 <= puVar5) {
        *(uint *)xdrs->x_data =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        xdrs->x_data = (uint8_t *)puVar15;
LAB_00112893:
        mVar3 = dmsg->rm_direction;
        puVar15 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_wrap < puVar15) {
          _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,mVar3);
          if (!_Var7) {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              uVar11 = (ulong)dmsg->rm_direction;
              pcVar14 = "%s:%u ERROR rm_direction %u";
              uVar12 = 0xc1;
              goto LAB_00112933;
            }
            goto LAB_00112d0f;
          }
        }
        else {
          *(msg_type *)xdrs->x_data =
               mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
          xdrs->x_data = (uint8_t *)puVar15;
        }
        rVar1 = __dscmp->rp_stat;
        puVar15 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_wrap < puVar15) {
          _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,rVar1);
          if (!_Var7) {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              uVar11 = (ulong)__dscmp->rp_stat;
              pcVar14 = "%s:%u ERROR rp_stat %u";
              uVar12 = 199;
              goto LAB_00112933;
            }
            goto LAB_00112d0f;
          }
        }
        else {
          *(reply_stat *)xdrs->x_data =
               rVar1 >> 0x18 | (rVar1 & 0xff0000) >> 8 | (rVar1 & 0xff00) << 8 | rVar1 << 0x18;
          xdrs->x_data = (uint8_t *)puVar15;
        }
        goto LAB_00112620;
      }
      _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      if (_Var7) goto LAB_00112893;
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        uVar11 = (ulong)dmsg->rm_xid;
        pcVar14 = "%s:%u ERROR rm_xid %u";
        uVar12 = 0xbb;
LAB_00112933:
        (*__ntirpc_pkg_params.warnx_)(pcVar14,"xdr_reply_encode",uVar12,uVar11);
      }
LAB_00112d0f:
      bVar6 = false;
      unaff_BPL = 0;
    }
    else {
      *puVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      mVar3 = dmsg->rm_direction;
      puVar9[1] = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
      rVar1 = (dmsg->ru).RM_rmb.rp_stat;
      puVar9[2] = rVar1 >> 0x18 | (rVar1 & 0xff0000) >> 8 | (rVar1 & 0xff00) << 8 | rVar1 << 0x18;
LAB_00112620:
      aVar4 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
      if (aVar4 == PROG_UNAVAIL) {
        if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED AUTH","xdr_reply_encode",0xee);
        }
        puVar9 = (uint *)xdrs->x_data;
        puVar5 = (uint *)(xdrs->x_v).vio_wrap;
        puVar15 = puVar9 + 2;
        if (puVar5 < puVar15) {
          puVar9 = (uint *)0x0;
        }
        else {
          xdrs->x_data = (uint8_t *)puVar15;
          if ((xdrs->x_v).vio_tail < puVar15) {
            (xdrs->x_v).vio_tail = (uint8_t *)puVar15;
            *(uint **)((long)xdrs->x_base + 0x10) = puVar15;
          }
        }
        aVar4 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
        if (puVar9 != (uint *)0x0) {
          *puVar9 = aVar4 >> 0x18 | (aVar4 & 0xff0000) >> 8 | (aVar4 & 0xff00) << 8 | aVar4 << 0x18;
          uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
          puVar9[1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
          goto LAB_00112c90;
        }
        puVar15 = (uint *)((long)xdrs->x_data + 4);
        if (puVar5 < puVar15) {
          _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,aVar4);
          if (_Var7) goto LAB_00112bc1;
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) goto LAB_00112d0f;
          uVar11 = (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
          pcVar14 = "%s:%u ERROR rj_stat %u";
          uVar12 = 0xf7;
        }
        else {
          *(accept_stat *)xdrs->x_data =
               aVar4 >> 0x18 | (aVar4 & 0xff0000) >> 8 | (aVar4 & 0xff00) << 8 | aVar4 << 0x18;
          xdrs->x_data = (uint8_t *)puVar15;
LAB_00112bc1:
          uVar13 = *(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4);
          puVar9 = (uint *)xdrs->x_data;
          puVar15 = puVar9 + 1;
          if (puVar15 <= (xdrs->x_v).vio_wrap) goto LAB_00112c88;
          _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar13);
          if (_Var7) goto LAB_00112c90;
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) goto LAB_00112d0f;
          uVar11 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
          pcVar14 = "%s:%u ERROR rj_why %u";
          uVar12 = 0xfd;
        }
LAB_00112d09:
        (*__ntirpc_pkg_params.warnx_)(pcVar14,"xdr_reply_encode",uVar12,uVar11);
        goto LAB_00112d0f;
      }
      if (aVar4 == SUCCESS) {
        if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED MISMATCH","xdr_reply_encode",0xd0);
        }
        puVar9 = (uint *)xdrs->x_data;
        puVar5 = (uint *)(xdrs->x_v).vio_wrap;
        puVar15 = puVar9 + 3;
        if (puVar5 < puVar15) {
          puVar9 = (uint *)0x0;
        }
        else {
          xdrs->x_data = (uint8_t *)puVar15;
          if ((xdrs->x_v).vio_tail < puVar15) {
            (xdrs->x_v).vio_tail = (uint8_t *)puVar15;
            *(uint **)((long)xdrs->x_base + 0x10) = puVar15;
          }
        }
        aVar4 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
        if (puVar9 == (uint *)0x0) {
          puVar15 = (uint *)((long)xdrs->x_data + 4);
          if (puVar5 < puVar15) {
            _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,aVar4);
            if (!_Var7) {
              if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
                uVar11 = (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
                pcVar14 = "%s:%u ERROR rj_stat %u";
                uVar12 = 0xda;
                goto LAB_00112d09;
              }
              goto LAB_00112d0f;
            }
          }
          else {
            *(accept_stat *)xdrs->x_data =
                 aVar4 >> 0x18 | (aVar4 & 0xff0000) >> 8 | (aVar4 & 0xff00) << 8 | aVar4 << 0x18;
            xdrs->x_data = (uint8_t *)puVar15;
          }
          uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
          puVar15 = (uint *)((long)xdrs->x_data + 4);
          if ((xdrs->x_v).vio_wrap < puVar15) {
            _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
            if (!_Var7) {
              if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
                uVar11 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
                pcVar14 = "%s:%u ERROR rj_vers.low %u";
                uVar12 = 0xe0;
                goto LAB_00112d09;
              }
              goto LAB_00112d0f;
            }
          }
          else {
            *(uint *)xdrs->x_data =
                 uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
            xdrs->x_data = (uint8_t *)puVar15;
          }
          uVar13 = *(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8);
          puVar9 = (uint *)xdrs->x_data;
          puVar15 = puVar9 + 1;
          if ((xdrs->x_v).vio_wrap < puVar15) {
            _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar13);
            if (!_Var7) {
              if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
                uVar11 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
                pcVar14 = "%s:%u ERROR rj_vers.high %u";
                uVar12 = 0xe6;
                goto LAB_00112d09;
              }
              goto LAB_00112d0f;
            }
          }
          else {
LAB_00112c88:
            *puVar9 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                      uVar13 << 0x18;
            xdrs->x_data = (uint8_t *)puVar15;
          }
        }
        else {
          *puVar9 = aVar4 >> 0x18 | (aVar4 & 0xff0000) >> 8 | (aVar4 & 0xff00) << 8 | aVar4 << 0x18;
          uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
          puVar9[1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
          uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
          puVar9[2] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
        }
LAB_00112c90:
        unaff_BPL = 1;
        bVar6 = false;
      }
      else {
        bVar6 = true;
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR rr->rj_stat (%u)","xdr_reply_encode",0x105);
        }
      }
    }
    if (!bVar6) goto LAB_00112d17;
  }
  else if (rVar1 == MSG_ACCEPTED) {
    uVar2 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
    if ((ulong)uVar2 < 0x191) {
      puVar15 = (uint *)xdrs->x_data;
      puVar10 = (uint8_t *)((long)puVar15 + (ulong)(uVar2 + 3 & 0x3fc) + 0x18);
      if ((xdrs->x_v).vio_wrap < puVar10) {
        puVar15 = (uint *)0x0;
      }
      else {
        xdrs->x_data = puVar10;
        if ((xdrs->x_v).vio_tail < puVar10) {
          (xdrs->x_v).vio_tail = puVar10;
          *(uint8_t **)((long)xdrs->x_base + 0x10) = puVar10;
        }
      }
      __unp = &(dmsg->ru).RM_rmb.ru;
      if (puVar15 != (uint *)0x0) {
        if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ACCEPTED INLINE","xdr_reply_encode",0x5d);
        }
        uVar2 = dmsg->rm_xid;
        *puVar15 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        mVar3 = dmsg->rm_direction;
        puVar15[1] = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18
        ;
        rVar1 = (dmsg->ru).RM_rmb.rp_stat;
        puVar15[2] = rVar1 >> 0x18 | (rVar1 & 0xff0000) >> 8 | (rVar1 & 0xff00) << 8 | rVar1 << 0x18
        ;
        uVar2 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_flavor;
        puVar15[3] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
        ;
        uVar2 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
        puVar15[4] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
        ;
        puVar15 = puVar15 + 5;
        uVar11 = (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
        if (uVar11 != 0) {
          memcpy(puVar15,(void *)((long)&(dmsg->ru).RM_rmb.ru + 0x20),uVar11);
          puVar15 = (uint *)((long)puVar15 +
                            (ulong)((dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length + 3 & 0xfffffffc));
        }
        aVar4 = (__unp->RP_ar).ar_stat;
        *puVar15 = aVar4 >> 0x18 | (aVar4 & 0xff0000) >> 8 | (aVar4 & 0xff00) << 8 | aVar4 << 0x18;
        unaff_BPL = 1;
        if ((__unp->RP_ar).ar_stat != PROG_MISMATCH) {
          if (((__unp->RP_ar).ar_stat == SUCCESS) &&
             ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0)) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u SUCCESS","xdr_reply_encode",0x6d);
          }
          goto LAB_00112d17;
        }
        if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u MISMATCH","xdr_reply_encode",0x73);
        }
        puVar9 = (uint *)xdrs->x_data;
        puVar5 = (uint *)(xdrs->x_v).vio_wrap;
        puVar15 = puVar9 + 2;
        if (puVar5 < puVar15) {
          puVar9 = (uint *)0x0;
        }
        else {
          xdrs->x_data = (uint8_t *)puVar15;
          if ((xdrs->x_v).vio_tail < puVar15) {
            (xdrs->x_v).vio_tail = (uint8_t *)puVar15;
            *(uint **)((long)xdrs->x_base + 0x10) = puVar15;
          }
        }
        uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
        if (puVar9 != (uint *)0x0) {
          *puVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
          puVar9[1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
          goto LAB_00112d17;
        }
        puVar15 = (uint *)((long)xdrs->x_data + 4);
        if (puVar5 < puVar15) {
          _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
          if (!_Var7) {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              unaff_BPL = 0;
              (*__ntirpc_pkg_params.warnx_)
                        ("%s:%u ERROR ar_vers.low %u","xdr_reply_encode",0x7d,
                         (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8));
              goto LAB_00112d17;
            }
            goto LAB_00112d15;
          }
        }
        else {
          *(uint *)xdrs->x_data =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          xdrs->x_data = (uint8_t *)puVar15;
        }
        uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
        puVar15 = (uint *)((long)xdrs->x_data + 4);
        if (puVar15 <= (xdrs->x_v).vio_wrap) {
          *(uint *)xdrs->x_data =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          xdrs->x_data = (uint8_t *)puVar15;
          goto LAB_00112d17;
        }
        _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
        if (_Var7) goto LAB_00112d17;
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) goto LAB_00112d15;
        uVar11 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
        pcVar14 = "%s:%u ERROR ar_vers.high %u";
        uVar12 = 0x84;
LAB_00112ad6:
        unaff_BPL = 0;
        (*__ntirpc_pkg_params.warnx_)(pcVar14,"xdr_reply_encode",uVar12,uVar11);
        goto LAB_00112d17;
      }
      if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ACCEPTED non-INLINE","xdr_reply_encode",0x94);
      }
      uVar2 = dmsg->rm_xid;
      puVar15 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar15) {
        _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
        if (!_Var7) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            uVar11 = (ulong)dmsg->rm_xid;
            pcVar14 = "%s:%u ERROR rm_xid %u";
            uVar12 = 0x98;
            goto LAB_00112ad6;
          }
          goto LAB_00112d15;
        }
      }
      else {
        *(uint *)xdrs->x_data =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        xdrs->x_data = (uint8_t *)puVar15;
      }
      mVar3 = dmsg->rm_direction;
      __choices = (xdr_discrim *)((long)xdrs->x_data + 4);
      if ((xdr_discrim *)(xdrs->x_v).vio_wrap < __choices) {
        _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,mVar3);
        if (!_Var7) {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) goto LAB_00112d15;
          uVar11 = (ulong)dmsg->rm_direction;
          pcVar14 = "%s:%u ERROR rm_direction %u";
          uVar12 = 0x9f;
          goto LAB_00112ad6;
        }
      }
      else {
        *(msg_type *)xdrs->x_data =
             mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
        xdrs->x_data = (uint8_t *)__choices;
      }
      bVar8 = xdr_union((XDR *)xdrs,(enum_t *)__dscmp,(char *)__unp,__choices,in_R8);
      unaff_BPL = 1;
      if ((char)bVar8 != '\0') goto LAB_00112d17;
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        unaff_BPL = 0;
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR inline_xdr_union","xdr_reply_encode",0xa9);
        goto LAB_00112d17;
      }
    }
    else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      unaff_BPL = 0;
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR ar_verf.oa_length (%u) > %u","xdr_reply_encode",0x52,(ulong)uVar2,400)
      ;
      goto LAB_00112d17;
    }
  }
  else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR dmsg->rm_reply.rp_stat (%u)","xdr_reply_encode",0x10e);
  }
LAB_00112d15:
  unaff_BPL = 0;
LAB_00112d17:
  return (_Bool)(unaff_BPL & 1);
}

Assistant:

bool
xdr_reply_encode(XDR *xdrs, struct rpc_msg *dmsg)
{
	struct opaque_auth *oa;
	int32_t *buf;

	switch (dmsg->rm_reply.rp_stat) {
	case MSG_ACCEPTED:
	{
		struct accepted_reply *ar = (struct accepted_reply *)
						&(dmsg->rm_reply.ru);

		oa = &ar->ar_verf;
		if (oa->oa_length > MAX_AUTH_BYTES) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR ar_verf.oa_length (%u) > %u",
				__func__, __LINE__,
				oa->oa_length,
				MAX_AUTH_BYTES);
			return (false);
		}
		buf = xdr_inline_encode(xdrs, 6 * BYTES_PER_XDR_UNIT
						+ RNDUP(oa->oa_length));

		if (buf != NULL) {
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u ACCEPTED INLINE",
				__func__, __LINE__);
			IXDR_PUT_INT32(buf, dmsg->rm_xid);
			IXDR_PUT_ENUM(buf, dmsg->rm_direction);
			IXDR_PUT_ENUM(buf, dmsg->rm_reply.rp_stat);
			IXDR_PUT_ENUM(buf, oa->oa_flavor);
			IXDR_PUT_INT32(buf, oa->oa_length);
			if (oa->oa_length) {
				memcpy(buf, oa->oa_body, oa->oa_length);
				buf += RNDUP(oa->oa_length) / sizeof(int32_t);
			}

			IXDR_PUT_ENUM(buf, ar->ar_stat);
			switch (ar->ar_stat) {
			case SUCCESS:
				__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
					"%s:%u SUCCESS",
					__func__, __LINE__);
				return (true);

			case PROG_MISMATCH:
				__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
					"%s:%u MISMATCH",
					__func__, __LINE__);
				buf = xdr_inline_encode(xdrs,
							2 * BYTES_PER_XDR_UNIT);
				if (buf != NULL) {
					IXDR_PUT_ENUM(buf, ar->ar_vers.low);
					IXDR_PUT_ENUM(buf, ar->ar_vers.high);
				} else if (!xdr_putuint32(xdrs,
							  ar->ar_vers.low)) {
					__warnx(TIRPC_DEBUG_FLAG_ERROR,
						"%s:%u ERROR ar_vers.low %u",
						__func__, __LINE__,
						ar->ar_vers.low);
					return (false);
				} else if (!xdr_putuint32(xdrs,
							  ar->ar_vers.high)) {
					__warnx(TIRPC_DEBUG_FLAG_ERROR,
						"%s:%u ERROR ar_vers.high %u",
						__func__, __LINE__,
						ar->ar_vers.high);
					return (false);
				}
				/* fallthru */
			case GARBAGE_ARGS:
			case SYSTEM_ERR:
			case PROC_UNAVAIL:
			case PROG_UNAVAIL:
				break;
			};
			return (true);
		}

		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u ACCEPTED non-INLINE",
			__func__, __LINE__);
		if (!xdr_putuint32(xdrs, dmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				dmsg->rm_xid);
			return (false);
		}
		if (!xdr_putenum(xdrs, dmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				dmsg->rm_direction);
			return (false);
		}
		if (!inline_xdr_union(xdrs,
				      (enum_t *) &(dmsg->rm_reply.rp_stat),
				      (void *)&(dmsg->rm_reply.ru),
				      reply_dscrm, NULL_xdrproc_t)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR inline_xdr_union",
				__func__, __LINE__);
			return (false);
		}
		return (true);
	}
	case MSG_DENIED:
	{
		struct rejected_reply *rr = (struct rejected_reply *)
						&(dmsg->rm_reply.ru);

		buf = xdr_inline_encode(xdrs, 3 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			IXDR_PUT_INT32(buf, dmsg->rm_xid);
			IXDR_PUT_ENUM(buf, dmsg->rm_direction);
			IXDR_PUT_ENUM(buf, dmsg->rm_reply.rp_stat);
		} else if (!xdr_putuint32(xdrs, dmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				dmsg->rm_xid);
			return (false);
		} else if (!xdr_putenum(xdrs, dmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				dmsg->rm_direction);
			return (false);
		} else if (!xdr_putenum(xdrs, dmsg->rm_reply.rp_stat)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rp_stat %u",
				__func__, __LINE__,
				dmsg->rm_reply.rp_stat);
			return (false);
		}

		switch (rr->rj_stat) {
		case RPC_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED MISMATCH",
				__func__, __LINE__);
			buf = xdr_inline_encode(xdrs, 3 * BYTES_PER_XDR_UNIT);

			if (buf != NULL) {
				IXDR_PUT_ENUM(buf, rr->rj_stat);
				IXDR_PUT_U_INT32(buf, rr->rj_vers.low);
				IXDR_PUT_U_INT32(buf, rr->rj_vers.high);
			} else if (!xdr_putenum(xdrs, rr->rj_stat)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_stat %u",
					__func__, __LINE__,
					rr->rj_stat);
				return (false);
			} else if (!xdr_putuint32(xdrs, rr->rj_vers.low)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.low %u",
					__func__, __LINE__,
					rr->rj_vers.low);
				return (false);
			} else if (!xdr_putuint32(xdrs, rr->rj_vers.high)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.high %u",
					__func__, __LINE__,
					rr->rj_vers.high);
				return (false);
			}
			return (true); /* bugfix */
		case AUTH_ERROR:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED AUTH",
				__func__, __LINE__);
			buf = xdr_inline_encode(xdrs, 2 * BYTES_PER_XDR_UNIT);

			if (buf != NULL) {
				IXDR_PUT_ENUM(buf, rr->rj_stat);
				IXDR_PUT_ENUM(buf, rr->rj_why);
			} else if (!xdr_putenum(xdrs, rr->rj_stat)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_stat %u",
					__func__, __LINE__,
					rr->rj_stat);
				return (false);
			} else if (!xdr_putenum(xdrs, rr->rj_why)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_why %u",
					__func__, __LINE__,
					rr->rj_why);
				return (false);
			}
			return (true); /* bugfix */
		default:
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rr->rj_stat (%u)",
				__func__, __LINE__,
				rr->rj_stat);
			break;
		};
		break;
	}
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_reply.rp_stat (%u)",
			__func__, __LINE__,
			dmsg->rm_reply.rp_stat);
		break;
	};

	return (false);
}